

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O2

void __thiscall hwtest::pgraph::MthdEmuEmuD3D0TexFormat::emulate_mthd(MthdEmuEmuD3D0TexFormat *this)

{
  uint32_t val;
  pgraph_state *state;
  uint32_t *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int i;
  long lVar5;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_celsius_pre_icmd(state);
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.val;
  puVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid + 1;
  *puVar1 = *puVar1 | 0x208000;
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
    uVar3 = uVar2 >> 0x14 & 0xf;
    uVar4 = 0x280;
    if (uVar3 < 4) {
      uVar4 = uVar3 * 0x80 + 0x100;
    }
    for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
      uVar3 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format
              [lVar5] & 0xff000039 |
              ((uVar2 >> 0x1c) - (uVar2 >> 0x18)) * 0x1000 + 0x1000 & 0xffff |
              (uVar2 >> 0x1c) * 0x110000 | uVar4;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format[lVar5] =
           uVar3;
      pgraph_celsius_icmd(state,(uint)lVar5 | 4,uVar3,false);
    }
    uVar2 = *(ushort *)((long)&(this->super_SingleMthdTest).super_MthdTest.val + 2) & 3;
    val = uVar2 + 0x4003ffc0;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_control_a[0] = val;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_control_a[1] =
         uVar2 | 0x3ffc0;
    pgraph_celsius_icmd(state,6,val,false);
    pgraph_celsius_icmd(state,7,(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                                bundle_tex_control_a[1],true);
    return;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		int fmt = 5;
		int sfmt = extr(val, 20, 4);
		if (sfmt == 0)
			fmt = 2;
		else if (sfmt == 1)
			fmt = 3;
		else if (sfmt == 2)
			fmt = 4;
		else if (sfmt == 3)
			fmt = 5;
		int max_l = extr(val, 28, 4);
		int min_l = extr(val, 24, 4);
		insrt(exp.valid[1], 21, 1, 1);
		insrt(exp.valid[1], 15, 1, 1);
		if (!extr(exp.nsource, 1, 1)) {
			for (int i = 0; i < 2; i++) {
				insrt(exp.bundle_tex_format[i], 1, 1, 0);
				insrt(exp.bundle_tex_format[i], 2, 1, 0);
				insrt(exp.bundle_tex_format[i], 6, 1, 0);
				insrt(exp.bundle_tex_format[i], 7, 5, fmt);
				insrt(exp.bundle_tex_format[i], 12, 4, max_l - min_l + 1);
				insrt(exp.bundle_tex_format[i], 16, 4, max_l);
				insrt(exp.bundle_tex_format[i], 20, 4, max_l);
				pgraph_celsius_icmd(&exp, 4 + i, exp.bundle_tex_format[i], false);
			}
			exp.bundle_tex_control_a[0] = 0x4003ffc0 | extr(val, 16, 2);
			exp.bundle_tex_control_a[1] = 0x3ffc0 | extr(val, 16, 2);
			pgraph_celsius_icmd(&exp, 6, exp.bundle_tex_control_a[0], false);
			pgraph_celsius_icmd(&exp, 7, exp.bundle_tex_control_a[1], true);
		}
	}